

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O0

int mmdnum_(int *neqns,int *perm,int *invp,int *qsize)

{
  int iVar1;
  int i__1;
  int *qsize_local;
  int *invp_local;
  int *perm_local;
  int *neqns_local;
  
  iVar1 = *neqns;
  for (mmdnum_::node = 1; mmdnum_::node <= iVar1; mmdnum_::node = mmdnum_::node + 1) {
    mmdnum_::nqsize = qsize[(long)mmdnum_::node + -1];
    if (mmdnum_::nqsize < 1) {
      perm[(long)mmdnum_::node + -1] = invp[(long)mmdnum_::node + -1];
    }
    if (0 < mmdnum_::nqsize) {
      perm[(long)mmdnum_::node + -1] = -invp[(long)mmdnum_::node + -1];
    }
  }
  iVar1 = *neqns;
  for (mmdnum_::node = 1; mmdnum_::node <= iVar1; mmdnum_::node = mmdnum_::node + 1) {
    if (perm[(long)mmdnum_::node + -1] < 1) {
      mmdnum_::father = mmdnum_::node;
      while (perm[(long)mmdnum_::father + -1] < 1) {
        mmdnum_::father = -perm[(long)mmdnum_::father + -1];
      }
      mmdnum_::root = mmdnum_::father;
      mmdnum_::num = perm[(long)mmdnum_::father + -1] + 1;
      invp[(long)mmdnum_::node + -1] = -mmdnum_::num;
      perm[(long)mmdnum_::root + -1] = mmdnum_::num;
      mmdnum_::father = mmdnum_::node;
      while (mmdnum_::nextf = -perm[(long)mmdnum_::father + -1],
            perm[(long)mmdnum_::father + -1] < 0) {
        perm[(long)mmdnum_::father + -1] = -mmdnum_::root;
        mmdnum_::father = mmdnum_::nextf;
      }
    }
  }
  iVar1 = *neqns;
  for (mmdnum_::node = 1; mmdnum_::node <= iVar1; mmdnum_::node = mmdnum_::node + 1) {
    mmdnum_::num = -invp[(long)mmdnum_::node + -1];
    invp[(long)mmdnum_::node + -1] = mmdnum_::num;
    perm[(long)mmdnum_::num + -1] = mmdnum_::node;
  }
  return 0;
}

Assistant:

int mmdnum_(int* neqns, int* perm, int* invp, int* qsize)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    static int node, root, nextf, father, nqsize, num;


/* *************************************************************** */

/*         INTEGER*2  INVP(1)  , PERM(1)  , QSIZE(1) */

/* *************************************************************** */

    /* Parameter adjustments */
    --qsize; --invp; --perm;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        nqsize = qsize[node];
        if (nqsize <= 0) {
            perm[node] = invp[node];
        }
        if (nqsize > 0) {
            perm[node] = -invp[node];
        }
/* L100: */
    }
/*        ------------------------------------------------------ */
/*        FOR EACH NODE WHICH HAS BEEN MERGED, DO THE FOLLOWING. */
/*        ------------------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        if (perm[node] > 0) {
            goto L500;
        }
/*                ----------------------------------------- */
/*                TRACE THE MERGED TREE UNTIL ONE WHICH HAS */
/*                NOT BEEN MERGED, CALL IT ROOT. */
/*                ----------------------------------------- */
        father = node;
L200:
        if (perm[father] > 0) {
            goto L300;
        }
        father = -perm[father];
        goto L200;
L300:
/*                ----------------------- */
/*                NUMBER NODE AFTER ROOT. */
/*                ----------------------- */
        root = father;
        num = perm[root] + 1;
        invp[node] = -num;
        perm[root] = num;
/*                ------------------------ */
/*                SHORTEN THE MERGED TREE. */
/*                ------------------------ */
        father = node;
L400:
        nextf = -perm[father];
        if (nextf <= 0) {
            goto L500;
        }
        perm[father] = -root;
        father = nextf;
        goto L400;
L500:
        ;
    }
/*        ---------------------- */
/*        READY TO COMPUTE PERM. */
/*        ---------------------- */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        num = -invp[node];
        invp[node] = num;
        perm[num] = node;
/* L600: */
    }
    return 0;

}